

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

void __thiscall
presolve::HPresolve::substitute(HPresolve *this,HighsInt row,HighsInt col,double rhs)

{
  int iVar1;
  int row_00;
  int col_00;
  HighsLp *pHVar2;
  pointer pdVar3;
  int *piVar4;
  uint *puVar5;
  HighsInt HVar6;
  char *__name;
  int *piVar7;
  uint *puVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  HighsCDouble HVar13;
  HighsCDouble objscale;
  HighsCDouble local_40;
  
  HVar6 = findNonzero(this,row,col);
  dVar9 = -1.0 / (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[HVar6];
  markRowDeleted(this,row);
  (this->changedColFlag).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[col] = '\x01';
  (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[col] = '\x01';
  this->numDeletedCols = this->numDeletedCols + 1;
  iVar1 = (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  while (iVar1 != -1) {
    __name = (char *)(long)iVar1;
    row_00 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[(long)__name];
    iVar1 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(long)__name];
    if (row_00 != row) {
      dVar10 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[(long)__name] * dVar9;
      unlink(this,__name);
      pHVar2 = this->model;
      pdVar3 = (pHVar2->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar12 = pdVar3[row_00];
      dVar11 = dVar10 * rhs;
      if (-INFINITY < dVar12) {
        pdVar3[row_00] = dVar12 + dVar11;
      }
      pdVar3 = (pHVar2->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar12 = pdVar3[row_00];
      if (dVar12 < INFINITY) {
        pdVar3[row_00] = dVar11 + dVar12;
      }
      piVar4 = (this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (piVar7 = (this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start; piVar7 != piVar4; piVar7 = piVar7 + 1) {
        col_00 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[*piVar7];
        if (col_00 != col) {
          addToMatrix(this,row_00,col_00,
                      (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[*piVar7] * dVar10);
        }
      }
      reinsertEquation(this,row_00);
    }
  }
  pHVar2 = this->model;
  dVar12 = (pHVar2->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[col];
  if ((dVar12 != 0.0) || (NAN(dVar12))) {
    local_40.hi = dVar9 * (pHVar2->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[col];
    local_40.lo = 0.0;
    dVar9 = pHVar2->offset_;
    HVar13 = HighsCDouble::operator*(&local_40,rhs);
    dVar12 = HVar13.hi;
    dVar10 = dVar9 - dVar12;
    this->model->offset_ =
         (((dVar9 - (dVar12 + dVar10)) + (-dVar12 - (dVar10 - (dVar12 + dVar10)))) - HVar13.lo) +
         dVar10;
    piVar7 = (this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar7 != piVar4) {
      do {
        iVar1 = *piVar7;
        dVar9 = (this->model->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_start
                [(this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar1]];
        HVar13 = HighsCDouble::operator*
                           (&local_40,
                            (this->Avalue).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[iVar1]);
        dVar12 = HVar13.hi;
        dVar10 = dVar9 + dVar12;
        dVar10 = (dVar9 - (dVar10 - dVar12)) + (dVar12 - (dVar10 - (dVar10 - dVar12))) + HVar13.lo +
                 dVar10;
        iVar1 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar1];
        pdVar3 = (this->model->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pdVar3[iVar1] = dVar10;
        if (ABS(dVar10) <= (this->options->super_HighsOptionsStruct).small_matrix_value) {
          pdVar3[iVar1] = 0.0;
        }
        piVar7 = piVar7 + 1;
      } while (piVar7 != piVar4);
    }
    (this->model->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = 0.0;
  }
  puVar5 = (uint *)(this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  for (puVar8 = (uint *)(this->rowpositions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start; puVar8 != puVar5; puVar8 = puVar8 + 1) {
    unlink(this,(char *)(ulong)*puVar8);
  }
  return;
}

Assistant:

void HPresolve::substitute(HighsInt row, HighsInt col, double rhs) {
  assert(!rowDeleted[row]);
  assert(!colDeleted[col]);
  HighsInt pos = findNonzero(row, col);
  assert(pos != -1);

  assert(Arow[pos] == row);
  assert(Acol[pos] == col);
  double substrowscale = -1.0 / Avalue[pos];
  assert(isImpliedFree(col));

  markRowDeleted(row);
  markColDeleted(col);

  // substitute the column in each row where it occurs
  for (HighsInt coliter = colhead[col]; coliter != -1;) {
    HighsInt colrow = Arow[coliter];
    double colval = Avalue[coliter];

    // walk to the next position before doing any modifications, because
    // the current position will be deleted in the loop below
    assert(Acol[coliter] == col);
    HighsInt colpos = coliter;
    coliter = Anext[coliter];

    // skip the row that is used for substitution
    if (row == colrow) continue;

    assert(findNonzero(colrow, col) != -1);

    // cancels out and bounds of dual row for this column do not need to be
    // updated
    unlink(colpos);

    // printf("\nbefore substitution: ");
    // debugPrintRow(colrow);

    // determine the scale for the substitution row for addition to this row
    double scale = colval * substrowscale;

    // adjust the sides
    if (model->row_lower_[colrow] != -kHighsInf)
      model->row_lower_[colrow] += scale * rhs;

    if (model->row_upper_[colrow] != kHighsInf)
      model->row_upper_[colrow] += scale * rhs;

    for (HighsInt rowiter : rowpositions) {
      assert(Arow[rowiter] == row);

      if (Acol[rowiter] != col)
        addToMatrix(colrow, Acol[rowiter], scale * Avalue[rowiter]);
    }

    // check if this is an equation row and it now has a different size
    reinsertEquation(colrow);
    // printf("after substitution: ");
    // debugPrintRow(colrow);
  }

  assert(colsize[col] == 1);

  // substitute column in the objective function
  if (model->col_cost_[col] != 0.0) {
    HighsCDouble objscale = model->col_cost_[col] * substrowscale;
    model->offset_ = static_cast<double>(model->offset_ - objscale * rhs);
    assert(std::isfinite(model->offset_));
    for (HighsInt rowiter : rowpositions) {
      // printf("changing col cost to %g = %g + %g * %g\n",
      // double(model->col_cost_[Acol[rowiter]] + objscale * Avalue[rowiter]),
      // model->col_cost_[Acol[rowiter]], double(objscale), Avalue[rowiter]);
      model->col_cost_[Acol[rowiter]] = static_cast<double>(
          model->col_cost_[Acol[rowiter]] + objscale * Avalue[rowiter]);
      if (std::abs(model->col_cost_[Acol[rowiter]]) <=
          options->small_matrix_value)
        model->col_cost_[Acol[rowiter]] = 0.0;
    }
    assert(std::abs(model->col_cost_[col]) <=
           std::max(options->dual_feasibility_tolerance,
                    kHighsTiny * std::abs(static_cast<double>(objscale))));
    model->col_cost_[col] = 0.0;
  }

  // finally remove the entries of the row that was used for substitution
  for (HighsInt rowiter : rowpositions) unlink(rowiter);
}